

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void DOCTEST_ANON_FUNC_73(void)

{
  code *pcVar1;
  char extraout_AL;
  double __x;
  ResultBuilder DOCTEST_RB_1;
  ExpressionDecomposer local_170 [4];
  long local_160 [4];
  ResultBuilder DOCTEST_RB;
  constraint_one_of_t<QString> c;
  tag_scalar_t<QString,_cfgfile::qstring_trait_t> tag;
  
  QString::QString((QString *)&DOCTEST_RB_1,"cfg");
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::tag_scalar_t
            (&tag,(string_t *)&DOCTEST_RB_1,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&DOCTEST_RB_1);
  c.m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c.m_list._M_t._M_impl.super__Rb_tree_header._M_header;
  c.super_constraint_t<QString>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_one_of_t_00157c40;
  c.m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c.m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c.m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c.m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QString::QString((QString *)&DOCTEST_RB_1,"one");
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)&c.m_list,(QString *)&DOCTEST_RB_1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&DOCTEST_RB_1);
  tag.m_constraint = &c.super_constraint_t<QString>;
  QString::QString((QString *)&DOCTEST_RB_1,"400");
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::set_value(&tag,(QString *)&DOCTEST_RB_1)
  ;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&DOCTEST_RB_1);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/Parser/main.cpp"
             ,0x49e,"false","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(local_170,DT_REQUIRE);
  local_160[0] = (ulong)local_170[0].m_at << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result
            ((Result *)&DOCTEST_RB_1,(Expression_lhs *)local_160);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,(Result *)&DOCTEST_RB_1);
  doctest::String::~String((String *)&DOCTEST_RB_1.super_AssertData.m_at);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  std::
  _Rb_tree<QString,_QString,_std::_Identity<QString>,_std::less<QString>,_std::allocator<QString>_>
  ::~_Rb_tree(&c.m_list._M_t);
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::~tag_scalar_t(&tag);
  return;
}

Assistant:

FirstTagWithMandatory()
		:	cfgfile::tag_t<>( "firstTag", false )
		,	m_started( false )
		,	m_finished( false )
		,	m_withString( false )
		,	m_child( *this )
	{
	}